

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidgetitemiterator.cpp
# Opt level: O3

void __thiscall
QTreeWidgetItemIterator::QTreeWidgetItemIterator
          (QTreeWidgetItemIterator *this,QTreeWidget *widget,IteratorFlags flags)

{
  bool bVar1;
  QTreeModel *pQVar2;
  QTreeWidgetItemIteratorPrivate *other;
  QTreeWidgetItem *pQVar3;
  long in_FS_OFFSET;
  QTreeWidgetItemIterator *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  (this->d_ptr).d = (QTreeWidgetItemIteratorPrivate *)0x0;
  this->current = (QTreeWidgetItem *)0x0;
  (this->flags).super_QFlagsStorageHelper<QTreeWidgetItemIterator::IteratorFlag,_4>.
  super_QFlagsStorage<QTreeWidgetItemIterator::IteratorFlag>.i =
       (Int)flags.super_QFlagsStorageHelper<QTreeWidgetItemIterator::IteratorFlag,_4>.
            super_QFlagsStorage<QTreeWidgetItemIterator::IteratorFlag>.i;
  QAbstractItemView::model((QAbstractItemView *)widget);
  pQVar2 = (QTreeModel *)QMetaObject::cast((QObject *)&QTreeModel::staticMetaObject);
  other = (QTreeWidgetItemIteratorPrivate *)operator_new(0x30);
  other->m_currentIndex = 0;
  other->m_model = pQVar2;
  (other->m_parentIndex).super_QList<int>.d.d = (Data *)0x0;
  (other->m_parentIndex).super_QList<int>.d.ptr = (int *)0x0;
  (other->m_parentIndex).super_QList<int>.d.size = 0;
  other->q_ptr = this;
  QScopedPointer<QTreeWidgetItemIteratorPrivate,_QScopedPointerDeleter<QTreeWidgetItemIteratorPrivate>_>
  ::reset(&this->d_ptr,other);
  local_28 = this;
  QtPrivate::QPodArrayOps<QTreeWidgetItemIterator*>::emplace<QTreeWidgetItemIterator*&>
            ((QPodArrayOps<QTreeWidgetItemIterator*> *)&pQVar2->iterators,(pQVar2->iterators).d.size
             ,&local_28);
  QList<QTreeWidgetItemIterator_*>::end(&pQVar2->iterators);
  pQVar3 = pQVar2->rootItem;
  if ((pQVar3->children).d.size == 0) {
    pQVar3 = this->current;
  }
  else {
    QTreeWidgetItem::executePendingSort(pQVar3);
    pQVar3 = *(pQVar3->children).d.ptr;
    this->current = pQVar3;
  }
  if (pQVar3 != (QTreeWidgetItem *)0x0) {
    bVar1 = matchesFlags(this,pQVar3);
    if (!bVar1) {
      operator++(this);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QTreeWidgetItemIterator::QTreeWidgetItemIterator(QTreeWidget *widget, IteratorFlags flags)
: current(nullptr), flags(flags)
{
    Q_ASSERT(widget);
    QTreeModel *model = qobject_cast<QTreeModel*>(widget->model());
    Q_ASSERT(model);
    d_ptr.reset(new QTreeWidgetItemIteratorPrivate(this, model));
    model->iterators.append(this);
    if (!model->rootItem->children.isEmpty()) current = model->rootItem->child(0);
    if (current && !matchesFlags(current))
        ++(*this);
}